

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_data.hpp
# Opt level: O1

void duckdb::ArrowListData<long>::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  append_vector_t p_Var1;
  Vector *other;
  reference pvVar2;
  pointer pAVar3;
  type pAVar4;
  long lVar5;
  idx_t count;
  vector<unsigned_int,_true> child_indices;
  SelectionVector child_sel;
  UnifiedVectorFormat format;
  Vector child_copy;
  vector<unsigned_int,_true> local_128;
  SelectionVector local_110;
  LogicalType local_f8;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  Vector::ToUnifiedFormat(input,input_size,&local_e0);
  local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  AppendValidity(append_data,&local_e0,from,to);
  AppendOffsets(append_data,&local_e0,from,to,&local_128);
  local_110.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_110.sel_vector =
       local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  other = ListVector::GetEntry(input);
  lVar5 = (long)local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  LogicalType::LogicalType(&local_f8,&other->type);
  Vector::Vector(&local_98,&local_f8,0x800);
  count = lVar5 >> 2;
  LogicalType::~LogicalType(&local_f8);
  Vector::Slice(&local_98,other,&local_110,count);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::operator[](&append_data->child_data,0);
  pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->(pvVar2);
  p_Var1 = pAVar3->append_vector;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::operator[](&append_data->child_data,0);
  pAVar4 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator*(pvVar2);
  (*p_Var1)(pAVar4,&local_98,0,count,count);
  append_data->row_count = append_data->row_count + (to - from);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_110.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);
		idx_t size = to - from;
		vector<sel_t> child_indices;
		AppendValidity(append_data, format, from, to);
		AppendOffsets(append_data, format, from, to, child_indices);

		// append the child vector of the list
		SelectionVector child_sel(child_indices.data());
		auto &child = ListVector::GetEntry(input);
		auto child_size = child_indices.size();
		Vector child_copy(child.GetType());
		child_copy.Slice(child, child_sel, child_size);
		append_data.child_data[0]->append_vector(*append_data.child_data[0], child_copy, 0, child_size, child_size);
		append_data.row_count += size;
	}